

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * coda_stristr(char *s,char *n)

{
  char cVar1;
  __int32_t *p_Var2;
  __int32_t **pp_Var3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar1 = *n;
    if ((long)cVar1 == 0) {
      return s;
    }
    cVar5 = *s;
    if (cVar5 != '\0') {
      pp_Var3 = __ctype_tolower_loc();
      p_Var2 = *pp_Var3;
      do {
        if (p_Var2[cVar5] == p_Var2[cVar1]) {
          cVar5 = *s;
          pcVar4 = n;
          if (cVar5 != '\0') {
            lVar6 = 0;
            do {
              if ((long)n[lVar6] == 0) goto LAB_001051c1;
              if (p_Var2[cVar5] != p_Var2[n[lVar6]]) break;
              pcVar4 = pcVar4 + 1;
              cVar5 = s[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (cVar5 != '\0');
            pcVar4 = n + lVar6;
          }
LAB_001051c1:
          if (*pcVar4 == '\0') {
            return s;
          }
        }
        cVar5 = s[1];
        s = s + 1;
      } while (cVar5 != '\0');
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_stristr(const char *s, const char *n)
{
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	for (; *s; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; *w && *x; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (!*x) return (char *) s;
		}
	}

	return NULL;
}